

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cpp
# Opt level: O0

void test_ptr<booster::clone_ptr<int>>(void)

{
  int iVar1;
  byte bVar2;
  int *piVar3;
  int *piVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  ostringstream oss_7;
  ostringstream oss_6;
  clone_ptr<int> y_3;
  clone_ptr<int> x_3;
  archive a_3;
  ostringstream oss_5;
  ostringstream oss_4;
  clone_ptr<int> y_2;
  clone_ptr<int> x_2;
  archive a_2;
  ostringstream oss_3;
  ostringstream oss_2;
  clone_ptr<int> y_1;
  clone_ptr<int> x_1;
  archive a_1;
  ostringstream oss_1;
  ostringstream oss;
  clone_ptr<int> y;
  clone_ptr<int> x;
  archive a;
  clone_ptr<int> *in_stack_ffffffffffffefe8;
  archive *in_stack_ffffffffffffeff0;
  string local_e28 [32];
  ostringstream local_e08 [383];
  undefined1 local_c89;
  string local_c88 [32];
  ostringstream local_c68 [376];
  clone_ptr<int> local_af0;
  clone_ptr<int> local_ae8;
  archive local_ae0 [63];
  undefined1 local_aa1;
  string local_aa0 [32];
  ostringstream local_a80 [383];
  undefined1 local_901;
  string local_900 [32];
  ostringstream local_8e0 [376];
  clone_ptr<int> local_768;
  clone_ptr<int> local_760;
  archive local_758 [63];
  undefined1 local_719;
  string local_718 [32];
  ostringstream local_6f8 [383];
  undefined1 local_579;
  string local_578 [32];
  ostringstream local_558 [376];
  clone_ptr<int> local_3e0;
  clone_ptr<int> local_3d8;
  archive local_3d0 [63];
  undefined1 local_391;
  string local_390 [32];
  ostringstream local_370 [383];
  undefined1 local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [376];
  clone_ptr<int> local_58 [3];
  clone_ptr<int> local_40;
  archive local_38 [56];
  
  cppcms::archive::archive(local_38);
  piVar3 = (int *)operator_new(4);
  *piVar3 = 0xf;
  booster::clone_ptr<int>::clone_ptr(&local_40,piVar3);
  booster::clone_ptr<int>::clone_ptr(local_58);
  cppcms::operator&(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  cppcms::archive::mode(local_38,1);
  cppcms::operator&(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  piVar3 = booster::clone_ptr<int>::operator*(&local_40);
  iVar1 = *piVar3;
  piVar3 = booster::clone_ptr<int>::operator*(local_58);
  if (iVar1 == *piVar3) {
    piVar3 = booster::clone_ptr<int>::get(&local_40);
    piVar4 = booster::clone_ptr<int>::get(local_58);
    if (piVar3 != piVar4) {
      bVar2 = cppcms::archive::eof();
      if ((bVar2 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_370);
        poVar5 = std::operator<<((ostream *)local_370,"Error ");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7b);
        std::operator<<(poVar5," a.eof()");
        local_391 = 1;
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar6,local_390);
        local_391 = 0;
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      booster::clone_ptr<int>::~clone_ptr((clone_ptr<int> *)in_stack_ffffffffffffeff0);
      booster::clone_ptr<int>::~clone_ptr((clone_ptr<int> *)in_stack_ffffffffffffeff0);
      cppcms::archive::~archive(local_38);
      cppcms::archive::archive(local_3d0);
      piVar3 = (int *)operator_new(4);
      *piVar3 = 0xf;
      booster::clone_ptr<int>::clone_ptr(&local_3d8,piVar3);
      booster::clone_ptr<int>::clone_ptr(&local_3e0);
      cppcms::operator<<(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      cppcms::archive::mode(local_3d0,1);
      cppcms::operator>>(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      piVar3 = booster::clone_ptr<int>::operator*(&local_3d8);
      iVar1 = *piVar3;
      piVar3 = booster::clone_ptr<int>::operator*(&local_3e0);
      if (iVar1 == *piVar3) {
        piVar3 = booster::clone_ptr<int>::get(&local_3d8);
        piVar4 = booster::clone_ptr<int>::get(&local_3e0);
        if (piVar3 != piVar4) {
          bVar2 = cppcms::archive::eof();
          if ((bVar2 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream(local_6f8);
            poVar5 = std::operator<<((ostream *)local_6f8,"Error ");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                    );
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x86);
            std::operator<<(poVar5," a.eof()");
            local_719 = 1;
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::runtime_error::runtime_error(prVar6,local_718);
            local_719 = 0;
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          booster::clone_ptr<int>::~clone_ptr((clone_ptr<int> *)in_stack_ffffffffffffeff0);
          booster::clone_ptr<int>::~clone_ptr((clone_ptr<int> *)in_stack_ffffffffffffeff0);
          cppcms::archive::~archive(local_3d0);
          cppcms::archive::archive(local_758);
          booster::clone_ptr<int>::clone_ptr(&local_760);
          piVar3 = (int *)operator_new(4);
          *piVar3 = 0xf;
          booster::clone_ptr<int>::clone_ptr(&local_768,piVar3);
          cppcms::operator&(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          cppcms::archive::mode(local_758,1);
          cppcms::operator&(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          piVar3 = booster::clone_ptr<int>::get(&local_768);
          if (piVar3 != (int *)0x0) {
            std::__cxx11::ostringstream::ostringstream(local_8e0);
            poVar5 = std::operator<<((ostream *)local_8e0,"Error ");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                    );
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8f);
            std::operator<<(poVar5," y.get()==0");
            local_901 = 1;
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::runtime_error::runtime_error(prVar6,local_900);
            local_901 = 0;
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar2 = cppcms::archive::eof();
          if ((bVar2 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream(local_a80);
            poVar5 = std::operator<<((ostream *)local_a80,"Error ");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                    );
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x90);
            std::operator<<(poVar5," a.eof()");
            local_aa1 = 1;
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::runtime_error::runtime_error(prVar6,local_aa0);
            local_aa1 = 0;
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          booster::clone_ptr<int>::~clone_ptr((clone_ptr<int> *)in_stack_ffffffffffffeff0);
          booster::clone_ptr<int>::~clone_ptr((clone_ptr<int> *)in_stack_ffffffffffffeff0);
          cppcms::archive::~archive(local_758);
          cppcms::archive::archive(local_ae0);
          booster::clone_ptr<int>::clone_ptr(&local_ae8);
          piVar3 = (int *)operator_new(4);
          *piVar3 = 0xf;
          booster::clone_ptr<int>::clone_ptr(&local_af0,piVar3);
          cppcms::operator<<(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          cppcms::archive::mode(local_ae0,1);
          cppcms::operator>>(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
          piVar3 = booster::clone_ptr<int>::get(&local_af0);
          if (piVar3 == (int *)0x0) {
            bVar2 = cppcms::archive::eof();
            if ((bVar2 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream(local_e08);
              poVar5 = std::operator<<((ostream *)local_e08,"Error ");
              poVar5 = std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                      );
              poVar5 = std::operator<<(poVar5,":");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9a);
              std::operator<<(poVar5," a.eof()");
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::ostringstream::str();
              std::runtime_error::runtime_error(prVar6,local_e28);
              __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            booster::clone_ptr<int>::~clone_ptr((clone_ptr<int> *)in_stack_ffffffffffffeff0);
            booster::clone_ptr<int>::~clone_ptr((clone_ptr<int> *)in_stack_ffffffffffffeff0);
            cppcms::archive::~archive(local_ae0);
            return;
          }
          std::__cxx11::ostringstream::ostringstream(local_c68);
          poVar5 = std::operator<<((ostream *)local_c68,"Error ");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x99);
          std::operator<<(poVar5," y.get()==0");
          local_c89 = 1;
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::str();
          std::runtime_error::runtime_error(prVar6,local_c88);
          local_c89 = 0;
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::ostringstream::ostringstream(local_558);
      poVar5 = std::operator<<((ostream *)local_558,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x85);
      std::operator<<(poVar5," *x==*y && x.get()!=y.get()");
      local_579 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_578);
      local_579 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  poVar5 = std::operator<<((ostream *)local_1d0,"Error ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/serialization_test.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7a);
  std::operator<<(poVar5," *x==*y && x.get()!=y.get()");
  local_1f1 = 1;
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar6,local_1f0);
  local_1f1 = 0;
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_ptr()
{
	{
		cppcms::archive a;
		Pointer x(new int(15)),y;
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer const x(new int(15));
		Pointer y;
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(*x==*y && x.get()!=y.get());
		TEST(a.eof());

	}
	{
		cppcms::archive a;
		Pointer x,y(new int(15));
		a & x;
		a.mode(cppcms::archive::load_from_archive);
		a & y;
		TEST(y.get()==0);
		TEST(a.eof());
	}
	{
		cppcms::archive a;
		Pointer const x;
		Pointer y(new int(15));
		a << x;
		a.mode(cppcms::archive::load_from_archive);
		a >> y;
		TEST(y.get()==0);
		TEST(a.eof());
	}

}